

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O0

void chaiscript::utility::add_class<chaiscript::parser::ChaiScript_Parser,chaiscript::Module>
               (Module *t_module,string *t_class_name,
               vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
               *t_constructors,
               vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *t_funcs)

{
  Type_Info ti;
  bool bVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  string *in_RSI;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *fun;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2_1;
  Proxy_Function *ctor;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  *__range2;
  string *this;
  Module *name;
  Proxy_Function *f;
  Module *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  string local_108 [48];
  reference local_d8;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d0;
  __normal_iterator<const_std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_c8;
  undefined8 local_c0;
  string local_b8 [48];
  reference local_88;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *local_80;
  __normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
  local_78;
  undefined8 local_70;
  string local_58 [32];
  string *local_38;
  Module *pMStack_30;
  Proxy_Function *local_28;
  undefined8 local_20;
  undefined8 local_18;
  string *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  user_type<chaiscript::parser::ChaiScript_Parser>();
  std::__cxx11::string::string(local_58,local_10);
  ti.m_bare_type_info = (type_info *)in_stack_fffffffffffffed8;
  ti.m_type_info = (type_info *)in_stack_fffffffffffffed0;
  ti._16_8_ = in_stack_fffffffffffffee0;
  Module::add(pMStack_30,ti,local_38);
  std::__cxx11::string::~string(local_58);
  local_70 = local_18;
  local_78._M_current =
       (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)
       std::
       vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
       ::begin((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                *)local_38);
  local_80 = (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)
             std::
             vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
             ::end((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                    *)local_38);
  this = local_38;
  name = pMStack_30;
  f = local_28;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                        *)name,(__normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                                *)this);
    if (!bVar1) break;
    local_88 = __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
               ::operator*(&local_78);
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::shared_ptr
              ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)name,
               (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)this);
    std::__cxx11::string::string(local_b8,local_10);
    Module::add(in_stack_fffffffffffffed0,f,(string *)name);
    std::__cxx11::string::~string(local_b8);
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
              ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x363e1f);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
    ::operator++(&local_78);
  }
  local_c0 = local_20;
  local_c8._M_current =
       (pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)std::
          vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::begin((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)this);
  local_d0 = (pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)std::
                vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)name,(__normal_iterator<const_std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)this);
    if (!bVar1) break;
    local_d8 = __gnu_cxx::
               __normal_iterator<const_std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*(&local_c8);
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::shared_ptr
              ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)name,
               (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)this);
    std::__cxx11::string::string(local_108,(string *)&local_d8->second);
    Module::add(in_stack_fffffffffffffed0,f,(string *)name);
    std::__cxx11::string::~string(local_108);
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
              ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x363f5f);
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&local_c8);
  }
  return;
}

Assistant:

void add_class(ModuleType &t_module,
          const std::string &t_class_name,
          const std::vector<chaiscript::Proxy_Function> &t_constructors,
          const std::vector<std::pair<chaiscript::Proxy_Function, std::string>> &t_funcs)
      {
        t_module.add(chaiscript::user_type<Class>(), t_class_name); 

        for(const chaiscript::Proxy_Function &ctor: t_constructors)
        {
          t_module.add(ctor, t_class_name);
        }

        for(const auto &fun: t_funcs)
        {
          t_module.add(fun.first, fun.second);
        }
      }